

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::Detail::anon_unknown_0::
StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::sync
          (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  string *in_stack_ffffffffffffff78;
  OutputDebugWriter *in_stack_ffffffffffffff80;
  allocator local_29;
  string local_28 [32];
  StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *local_8;
  
  local_8 = this;
  lVar1 = std::streambuf::pbase();
  lVar2 = std::streambuf::pptr();
  if (lVar1 != lVar2) {
    pcVar3 = (char *)std::streambuf::pbase();
    lVar1 = std::streambuf::pptr();
    lVar2 = std::streambuf::pbase();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,pcVar3,lVar1 - lVar2,&local_29);
    OutputDebugWriter::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    pcVar3 = (char *)std::streambuf::pbase();
    std::streambuf::epptr();
    std::streambuf::setp((char *)this,pcVar3);
  }
  return;
}

Assistant:

int sync() override {
                if( pbase() != pptr() ) {
                    m_writer( std::string( pbase(), static_cast<std::string::size_type>( pptr() - pbase() ) ) );
                    setp( pbase(), epptr() );
                }
                return 0;
            }